

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::detail::formatTruncated<unsigned_long>
               (ostream *out,unsigned_long *value,int ntrunc)

{
  char *pcVar1;
  ulong *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  string result;
  ostringstream tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  int *in_stack_fffffffffffffe10;
  ostringstream local_180 [376];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::ostream::operator<<(local_180,*in_RSI);
  std::__cxx11::ostringstream::str();
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (in_stack_fffffffffffffe08);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            (in_stack_fffffffffffffe08);
  std::min<int>(in_stack_fffffffffffffe10,(int *)in_stack_fffffffffffffe08);
  std::ostream::write(in_RDI,(long)pcVar1);
  std::__cxx11::string::~string(in_stack_fffffffffffffe08);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void formatTruncated(std::ostream& out, const T& value, int ntrunc)
{
    std::ostringstream tmp;
    tmp << value;
    std::string result = tmp.str();
    out.write(result.c_str(), (std::min)(ntrunc, static_cast<int>(result.size())));
}